

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test::
TestBody(AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test *this)

{
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *matcher;
  char *message;
  Arg *in_R9;
  string_view format;
  AssertionResult gtest_ar;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_190;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
  local_178;
  StringifySink local_160;
  string local_140;
  string local_120;
  Arg local_100;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  char *local_c8;
  TestRedactedMessage proto;
  string_view local_38 [3];
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  
  proto2_unittest::TestRedactedMessage::TestRedactedMessage(&proto);
  proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       proto.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    proto.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (proto.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&proto.field_0._impl_.meta_annotated_,"foo",
             (Arena *)proto.super_Message.super_MessageLite._internal_metadata_.ptr_);
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
  local_c8 = "goo\\.gle/.+  +";
  local_100.piece_._M_len = (size_t)&DAT_0000000c;
  local_100.piece_._M_str = "\\[REDACTED\\]";
  format._M_str = (char *)&local_d0;
  format._M_len = (size_t)"$0\nmeta_annotated: $1\n";
  absl::lts_20250127::Substitute_abi_cxx11_(&local_120,(lts_20250127 *)0x16,format,&local_100,in_R9)
  ;
  testing::MatchesRegex<std::__cxx11::string>(&local_190,(testing *)&local_120,regex);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
            (&local_178,(internal *)&local_190,matcher);
  local_160.buffer_._M_dataplus._M_p = (pointer)&local_160.buffer_.field_2;
  local_160.buffer_.field_2._M_allocated_capacity = 0;
  local_160.buffer_.field_2._8_8_ = 0;
  local_160.buffer_._M_string_length = 0;
  local_38[0] = absl::lts_20250127::strings_internal::
                ExtractStringification<proto2_unittest::TestRedactedMessage>(&local_160,&proto);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_140,(lts_20250127 *)local_38,(AlphaNum *)local_38[0]._M_str);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(&gtest_ar,(char *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "absl::StrCat(proto)");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_178.matcher_.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_190.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_120);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0xaaa,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_unittest::TestRedactedMessage::~TestRedactedMessage(&proto);
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyMetaAnnotatedIsRedacted) {
  unittest::TestRedactedMessage proto;
  proto.set_meta_annotated("foo");
  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "meta_annotated: $1\n",
                                       kTextMarkerRegex, value_replacement)));
}